

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::FBXConverter::GenerateNodeAnimations
          (FBXConverter *this,vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *node_anims,
          string *fixed_name,
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          *curves,LayerMap *layer_map,int64_t start,int64_t stop,double *max_time,double *min_time)

{
  uint uVar1;
  pointer ppAVar2;
  iterator __position;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *pvVar3;
  vector<aiNodeAnim*,std::allocator<aiNodeAnim*>> *this_00;
  bool bVar4;
  bool bVar5;
  AnimationCurveMap *pAVar6;
  vector<Assimp::FBX::AnimationCurveNode_const*,std::allocator<Assimp::FBX::AnimationCurveNode_const*>>
  *this_01;
  long lVar7;
  char *__s;
  iterator iVar8;
  mapped_type *pmVar9;
  aiNodeAnim *paVar10;
  Model *extraout_RDX;
  Model *extraout_RDX_00;
  Model *extraout_RDX_01;
  bool bVar11;
  pointer ppAVar12;
  bool bVar13;
  FBXConverter *this_02;
  iterator iVar14;
  TransformationComp TVar15;
  uint uVar16;
  Object *pOVar17;
  AnimationCurveNode *pAVar18;
  AnimationCurveNode *pAVar19;
  _Base_ptr p_Var20;
  aiNodeAnim *na;
  AnimationCurveNode *node;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  FBXConverter *local_280;
  aiNodeAnim *inv;
  vector<aiNodeAnim*,std::allocator<aiNodeAnim*>> *local_270;
  NodeMap node_property_map;
  const_iterator chain [17];
  aiNodeAnim *nd;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &node_property_map._M_t._M_impl.super__Rb_tree_header._M_header;
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppAVar12 = (curves->
             super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppAVar2 = (curves->
            super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_270 = (vector<aiNodeAnim*,std::allocator<aiNodeAnim*>> *)node_anims;
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ppAVar2 == ppAVar12) {
    __assert_fail("curves.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                  ,0xae1,
                  "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                 );
  }
  bVar5 = this->doc->settings->strictMode;
  pOVar17 = (Object *)0x0;
  do {
    pAVar18 = *ppAVar12;
    if (pOVar17 == (Object *)0x0) {
      pOVar17 = pAVar18->target;
    }
    if (pAVar18->target != pOVar17) {
      LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x5fc247);
    }
    if ((bVar5 != false) && (pAVar18->target != pOVar17)) {
      __assert_fail("node->Target() == target",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                    ,0xad0,
                    "void Assimp::FBX::validateAnimCurveNodes(const std::vector<const AnimationCurveNode *> &, bool)"
                   );
    }
    ppAVar12 = ppAVar12 + 1;
  } while (ppAVar12 != ppAVar2);
  ppAVar12 = (curves->
             super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppAVar2 = (curves->
            super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pAVar18 = (AnimationCurveNode *)0x0;
  if (ppAVar12 != ppAVar2) {
    pAVar19 = pAVar18;
    do {
      pAVar18 = *ppAVar12;
      node = pAVar18;
      if (pAVar18 == (AnimationCurveNode *)0x0) {
        __assert_fail("node",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                      ,0xae8,
                      "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                     );
      }
      if ((pAVar18->prop)._M_string_length == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)chain,
                       "target property for animation curve not set: ",&(pAVar18->super_Object).name
                      );
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&nd,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)chain);
        LogFunctions<Assimp::FBXImporter>::LogWarn((format *)&nd);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&nd);
        std::ios_base::~ios_base(local_138);
        pAVar18 = pAVar19;
        if (chain[0]._M_node != (_Base_ptr)(chain + 2)) {
          operator_delete(chain[0]._M_node,(ulong)((long)&(chain[2]._M_node)->_M_color + 1));
        }
      }
      else {
        pAVar6 = AnimationCurveNode::Curves_abi_cxx11_(pAVar18);
        if ((pAVar6->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)chain,
                         "no animation curves assigned to AnimationCurveNode: ",
                         &(node->super_Object).name);
          Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
          basic_formatter<std::__cxx11::string>
                    ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&nd,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)chain);
          LogFunctions<Assimp::FBXImporter>::LogWarn((format *)&nd);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&nd);
          std::ios_base::~ios_base(local_138);
          if (chain[0]._M_node != (_Base_ptr)(chain + 2)) {
            operator_delete(chain[0]._M_node,(ulong)((long)&(chain[2]._M_node)->_M_color + 1));
          }
        }
        else {
          this_01 = (vector<Assimp::FBX::AnimationCurveNode_const*,std::allocator<Assimp::FBX::AnimationCurveNode_const*>>
                     *)std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
                       ::operator[](&node_property_map,&node->prop);
          __position._M_current = *(AnimationCurveNode ***)(this_01 + 8);
          if (__position._M_current == *(AnimationCurveNode ***)(this_01 + 0x10)) {
            std::
            vector<Assimp::FBX::AnimationCurveNode_const*,std::allocator<Assimp::FBX::AnimationCurveNode_const*>>
            ::_M_realloc_insert<Assimp::FBX::AnimationCurveNode_const*const&>
                      (this_01,__position,&node);
          }
          else {
            *__position._M_current = node;
            *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
          }
        }
      }
      ppAVar12 = ppAVar12 + 1;
      pAVar19 = pAVar18;
    } while (ppAVar12 != ppAVar2);
  }
  if (pAVar18 == (AnimationCurveNode *)0x0) {
    __assert_fail("curve_node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                  ,0xaf8,
                  "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                 );
  }
  pOVar17 = pAVar18->target;
  if ((pOVar17 == (Object *)0x0) ||
     (lVar7 = __dynamic_cast(pOVar17,&Object::typeinfo,&Model::typeinfo,0), lVar7 == 0)) {
    __assert_fail("curve_node->TargetAsModel()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                  ,0xaf9,
                  "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                 );
  }
  if (pOVar17 == (Object *)0x0) {
    local_280 = (FBXConverter *)0x0;
  }
  else {
    local_280 = (FBXConverter *)__dynamic_cast(pOVar17,&Object::typeinfo,&Model::typeinfo,0);
  }
  paVar10 = (aiNodeAnim *)chain;
  bVar11 = false;
  iVar14._M_current = (aiNodeAnim **)0x0;
  memset(paVar10,0,0x88);
  pvVar3 = &local_280->meshes;
  lVar7 = 0;
  bVar13 = false;
  bVar5 = false;
  do {
    TVar15 = (TransformationComp)lVar7;
    if ((TVar15 & (TransformationComp_GeometricScaling|TransformationComp_ScalingPivot)) ==
        TransformationComp_RotationPivotInverse) {
      chain[lVar7]._M_node = &node_property_map._M_t._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      __s = NameTransformationCompProperty((FBXConverter *)paVar10,TVar15);
      std::__cxx11::string::string<std::allocator<char>>((string *)&nd,__s,(allocator<char> *)&node)
      ;
      iVar14._M_current = &nd;
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
              ::find(&node_property_map._M_t,(key_type *)&nd);
      chain[lVar7]._M_node = iVar8._M_node;
      paVar10 = nd;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)nd != local_198) {
        iVar14._M_current = (aiNodeAnim **)(local_198[0]._M_allocated_capacity + 1);
        operator_delete(nd,(ulong)iVar14._M_current);
      }
      if ((_Rb_tree_header *)chain[lVar7]._M_node !=
          &node_property_map._M_t._M_impl.super__Rb_tree_header) {
        if ((this->doc->settings->optimizeEmptyAnimationCurves == true) &&
           (iVar14._M_current = (aiNodeAnim **)local_280,
           bVar4 = IsRedundantAnimationData
                             ((FBXConverter *)paVar10,(Model *)local_280,TVar15,
                              (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                               *)(chain[lVar7]._M_node + 2)), bVar4)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&node,
                         "dropping redundant animation channel for node ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &(pvVar3->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                          super__Vector_impl_data._M_finish);
          Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
          basic_formatter<std::__cxx11::string>
                    ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&nd,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&node);
          LogFunctions<Assimp::FBXImporter>::LogDebug((format *)&nd);
          iVar14._M_current = (aiNodeAnim **)&std::__cxx11::ostringstream::VTT;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&nd);
          std::ios_base::~ios_base(local_138);
          paVar10 = (aiNodeAnim *)node;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)node != &local_290) {
            iVar14._M_current = (aiNodeAnim **)(local_290._M_allocated_capacity + 1);
            operator_delete(node,(ulong)iVar14._M_current);
          }
        }
        else {
          bVar5 = bVar13;
          if ((TVar15 & (TransformationComp_GeometricScaling|TransformationComp_ScalingPivot)) !=
              TransformationComp_Translation) {
            bVar5 = true;
          }
          if (lVar7 == 0xc) {
            bVar5 = bVar13;
          }
          bVar11 = true;
          bVar13 = bVar5;
        }
      }
    }
    this_00 = local_270;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x11);
  if (bVar11) {
    if ((bVar5) ||
       (iVar14._M_current = (aiNodeAnim **)local_280,
       bVar5 = NeedsComplexTransformationChain((FBXConverter *)paVar10,(Model *)local_280), bVar5))
    {
      lVar7 = 0;
      uVar16 = 1;
      uVar1 = 0;
      do {
        p_Var20 = chain[lVar7]._M_node;
        if ((_Rb_tree_header *)p_Var20 != &node_property_map._M_t._M_impl.super__Rb_tree_header) {
          if (lVar7 == 0xd) {
            __assert_fail("comp != TransformationComp_ScalingPivotInverse",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                          ,0xb4c,
                          "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                         );
          }
          if (lVar7 == 9) {
            __assert_fail("comp != TransformationComp_RotationPivotInverse",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                          ,0xb4b,
                          "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                         );
          }
          TVar15 = (TransformationComp)lVar7;
          NameTransformationChainNode
                    ((string *)&nd,(FBXConverter *)iVar14._M_current,fixed_name,TVar15);
          na = (aiNodeAnim *)0x0;
          if (TransformationComp_GeometricScaling < TVar15) {
LAB_005fcb6b:
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                          ,0xbb0,
                          "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                         );
          }
          uVar1 = uVar1 | uVar16;
          if ((0x4c38U >>
               (TVar15 & (TransformationComp_GeometricScaling|TransformationComp_GeometricRotation))
              & 1) == 0) {
            if ((0x81c0U >>
                 (TVar15 & (TransformationComp_GeometricScaling|TransformationComp_GeometricRotation
                           )) & 1) == 0) {
              if ((0x11000U >>
                   (TVar15 & (TransformationComp_GeometricScaling|
                             TransformationComp_GeometricRotation)) & 1) == 0) goto LAB_005fcb6b;
              na = GenerateScalingNodeAnim
                             (this,(string *)&nd,extraout_RDX,
                              (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                               *)(p_Var20 + 2),layer_map,start,stop,max_time,min_time);
            }
            else {
              na = GenerateRotationNodeAnim
                             (this,(string *)&nd,(Model *)local_280,
                              (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                               *)(p_Var20 + 2),layer_map,start,stop,max_time,min_time);
            }
          }
          else {
            p_Var20 = p_Var20 + 2;
            this_02 = (FBXConverter *)&nd;
            na = GenerateTranslationNodeAnim
                           (this,(string *)this_02,extraout_RDX,
                            (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                             *)p_Var20,layer_map,start,stop,max_time,min_time,false);
            if (lVar7 == 5) {
              NameTransformationChainNode
                        ((string *)&node,this_02,fixed_name,TransformationComp_RotationPivotInverse)
              ;
              paVar10 = GenerateTranslationNodeAnim
                                  (this,(string *)&node,extraout_RDX_00,
                                   (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                                    *)p_Var20,layer_map,start,stop,max_time,min_time,true);
              inv = paVar10;
              if (paVar10 == (aiNodeAnim *)0x0) {
                __assert_fail("inv",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                              ,0xb7d,
                              "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                             );
              }
              if (((paVar10->mNumPositionKeys == 0) && (paVar10->mNumRotationKeys == 0)) &&
                 (paVar10->mNumScalingKeys == 0)) {
                aiNodeAnim::~aiNodeAnim(paVar10);
                operator_delete(paVar10,0x438);
              }
              else {
                iVar14._M_current = *(aiNodeAnim ***)(this_00 + 8);
                if (iVar14._M_current == *(aiNodeAnim ***)(this_00 + 0x10)) {
                  std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>::
                  _M_realloc_insert<aiNodeAnim*const&>(this_00,iVar14,&inv);
                }
                else {
                  *iVar14._M_current = paVar10;
                  *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)node != &local_290) {
                operator_delete(node,local_290._M_allocated_capacity + 1);
              }
              uVar1 = uVar1 | uVar16 << 4;
            }
            else if (lVar7 == 0xb) {
              NameTransformationChainNode
                        ((string *)&node,this_02,fixed_name,TransformationComp_ScalingPivotInverse);
              paVar10 = GenerateTranslationNodeAnim
                                  (this,(string *)&node,extraout_RDX_01,
                                   (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                                    *)p_Var20,layer_map,start,stop,max_time,min_time,true);
              inv = paVar10;
              if (paVar10 != (aiNodeAnim *)0x0) {
                if (((paVar10->mNumPositionKeys == 0) && (paVar10->mNumRotationKeys == 0)) &&
                   (paVar10->mNumScalingKeys == 0)) {
                  aiNodeAnim::~aiNodeAnim(paVar10);
                  operator_delete(paVar10,0x438);
                }
                else {
                  std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::push_back
                            ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)local_270,&inv);
                }
                __assert_fail("TransformationComp_RotationPivotInverse > i",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                              ,0xb9d,
                              "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                             );
              }
              __assert_fail("inv",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                            ,0xb95,
                            "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                           );
            }
          }
          paVar10 = na;
          if (na == (aiNodeAnim *)0x0) {
            __assert_fail("na",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                          ,0xbb3,
                          "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                         );
          }
          if (((na->mNumPositionKeys == 0) && (na->mNumRotationKeys == 0)) &&
             (na->mNumScalingKeys == 0)) {
            aiNodeAnim::~aiNodeAnim(na);
            iVar14._M_current = (aiNodeAnim **)0x438;
            operator_delete(paVar10,0x438);
          }
          else {
            iVar14._M_current = *(aiNodeAnim ***)(this_00 + 8);
            if (iVar14._M_current == *(aiNodeAnim ***)(this_00 + 0x10)) {
              std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>::
              _M_realloc_insert<aiNodeAnim*const&>(this_00,iVar14,&na);
            }
            else {
              *iVar14._M_current = na;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)nd != local_198) {
            iVar14._M_current = (aiNodeAnim **)(local_198[0]._M_allocated_capacity + 1);
            operator_delete(nd,(ulong)iVar14._M_current);
          }
        }
        lVar7 = lVar7 + 1;
        uVar16 = uVar16 * 2;
      } while (lVar7 != 0x11);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[](&this->node_anim_chain_bits,fixed_name);
      *pmVar9 = uVar1;
    }
    else {
      paVar10 = GenerateSimpleNodeAnim
                          (this,fixed_name,(Model *)local_280,chain,
                           (const_iterator)&node_property_map._M_t._M_impl.super__Rb_tree_header,
                           layer_map,start,stop,max_time,min_time,true);
      nd = paVar10;
      if (paVar10 == (aiNodeAnim *)0x0) {
        __assert_fail("nd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                      ,0xb35,
                      "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                     );
      }
      if (((paVar10->mNumPositionKeys == 0) && (paVar10->mNumRotationKeys == 0)) &&
         (paVar10->mNumScalingKeys == 0)) {
        aiNodeAnim::~aiNodeAnim(paVar10);
        operator_delete(paVar10,0x438);
      }
      else {
        iVar14._M_current = *(aiNodeAnim ***)(this_00 + 8);
        if (iVar14._M_current == *(aiNodeAnim ***)(this_00 + 0x10)) {
          std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>::_M_realloc_insert<aiNodeAnim*const&>
                    (this_00,iVar14,&nd);
        }
        else {
          *iVar14._M_current = paVar10;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
      }
    }
  }
  else {
    LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x5fc8df);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
  ::~_Rb_tree(&node_property_map._M_t);
  return;
}

Assistant:

void FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim*>& node_anims,
            const std::string& fixed_name,
            const std::vector<const AnimationCurveNode*>& curves,
            const LayerMap& layer_map,
            int64_t start, int64_t stop,
            double& max_time,
            double& min_time)
        {

            NodeMap node_property_map;
            ai_assert(curves.size());

#ifdef ASSIMP_BUILD_DEBUG
            validateAnimCurveNodes(curves, doc.Settings().strictMode);
#endif
            const AnimationCurveNode* curve_node = nullptr;
            for (const AnimationCurveNode* node : curves) {
                ai_assert(node);

                if (node->TargetProperty().empty()) {
                    FBXImporter::LogWarn("target property for animation curve not set: " + node->Name());
                    continue;
                }

                curve_node = node;
                if (node->Curves().empty()) {
                    FBXImporter::LogWarn("no animation curves assigned to AnimationCurveNode: " + node->Name());
                    continue;
                }

                node_property_map[node->TargetProperty()].push_back(node);
            }

            ai_assert(curve_node);
            ai_assert(curve_node->TargetAsModel());

            const Model& target = *curve_node->TargetAsModel();

            // check for all possible transformation components
            NodeMap::const_iterator chain[TransformationComp_MAXIMUM];

            bool has_any = false;
            bool has_complex = false;

            for (size_t i = 0; i < TransformationComp_MAXIMUM; ++i) {
                const TransformationComp comp = static_cast<TransformationComp>(i);

                // inverse pivots don't exist in the input, we just generate them
                if (comp == TransformationComp_RotationPivotInverse || comp == TransformationComp_ScalingPivotInverse) {
                    chain[i] = node_property_map.end();
                    continue;
                }

                chain[i] = node_property_map.find(NameTransformationCompProperty(comp));
                if (chain[i] != node_property_map.end()) {

                    // check if this curves contains redundant information by looking
                    // up the corresponding node's transformation chain.
                    if (doc.Settings().optimizeEmptyAnimationCurves &&
                        IsRedundantAnimationData(target, comp, (*chain[i]).second)) {

                        FBXImporter::LogDebug("dropping redundant animation channel for node " + target.Name());
                        continue;
                    }

                    has_any = true;

                    if (comp != TransformationComp_Rotation && comp != TransformationComp_Scaling && comp != TransformationComp_Translation)
                    {
                        has_complex = true;
                    }
                }
            }

            if (!has_any) {
                FBXImporter::LogWarn("ignoring node animation, did not find any transformation key frames");
                return;
            }

            // this needs to play nicely with GenerateTransformationNodeChain() which will
            // be invoked _later_ (animations come first). If this node has only rotation,
            // scaling and translation _and_ there are no animated other components either,
            // we can use a single node and also a single node animation channel.
            if (!has_complex && !NeedsComplexTransformationChain(target)) {

                aiNodeAnim* const nd = GenerateSimpleNodeAnim(fixed_name, target, chain,
                    node_property_map.end(),
                    layer_map,
                    start, stop,
                    max_time,
                    min_time,
                    true // input is TRS order, assimp is SRT
                );

                ai_assert(nd);
                if (nd->mNumPositionKeys == 0 && nd->mNumRotationKeys == 0 && nd->mNumScalingKeys == 0) {
                    delete nd;
                }
                else {
                    node_anims.push_back(nd);
                }
                return;
            }

            // otherwise, things get gruesome and we need separate animation channels
            // for each part of the transformation chain. Remember which channels
            // we generated and pass this information to the node conversion
            // code to avoid nodes that have identity transform, but non-identity
            // animations, being dropped.
            unsigned int flags = 0, bit = 0x1;
            for (size_t i = 0; i < TransformationComp_MAXIMUM; ++i, bit <<= 1) {
                const TransformationComp comp = static_cast<TransformationComp>(i);

                if (chain[i] != node_property_map.end()) {
                    flags |= bit;

                    ai_assert(comp != TransformationComp_RotationPivotInverse);
                    ai_assert(comp != TransformationComp_ScalingPivotInverse);

                    const std::string& chain_name = NameTransformationChainNode(fixed_name, comp);

                    aiNodeAnim* na = nullptr;
                    switch (comp)
                    {
                    case TransformationComp_Rotation:
                    case TransformationComp_PreRotation:
                    case TransformationComp_PostRotation:
                    case TransformationComp_GeometricRotation:
                        na = GenerateRotationNodeAnim(chain_name,
                            target,
                            (*chain[i]).second,
                            layer_map,
                            start, stop,
                            max_time,
                            min_time);

                        break;

                    case TransformationComp_RotationOffset:
                    case TransformationComp_RotationPivot:
                    case TransformationComp_ScalingOffset:
                    case TransformationComp_ScalingPivot:
                    case TransformationComp_Translation:
                    case TransformationComp_GeometricTranslation:
                        na = GenerateTranslationNodeAnim(chain_name,
                            target,
                            (*chain[i]).second,
                            layer_map,
                            start, stop,
                            max_time,
                            min_time);

                        // pivoting requires us to generate an implicit inverse channel to undo the pivot translation
                        if (comp == TransformationComp_RotationPivot) {
                            const std::string& invName = NameTransformationChainNode(fixed_name,
                                TransformationComp_RotationPivotInverse);

                            aiNodeAnim* const inv = GenerateTranslationNodeAnim(invName,
                                target,
                                (*chain[i]).second,
                                layer_map,
                                start, stop,
                                max_time,
                                min_time,
                                true);

                            ai_assert(inv);
                            if (inv->mNumPositionKeys == 0 && inv->mNumRotationKeys == 0 && inv->mNumScalingKeys == 0) {
                                delete inv;
                            }
                            else {
                                node_anims.push_back(inv);
                            }

                            ai_assert(TransformationComp_RotationPivotInverse > i);
                            flags |= bit << (TransformationComp_RotationPivotInverse - i);
                        }
                        else if (comp == TransformationComp_ScalingPivot) {
                            const std::string& invName = NameTransformationChainNode(fixed_name,
                                TransformationComp_ScalingPivotInverse);

                            aiNodeAnim* const inv = GenerateTranslationNodeAnim(invName,
                                target,
                                (*chain[i]).second,
                                layer_map,
                                start, stop,
                                max_time,
                                min_time,
                                true);

                            ai_assert(inv);
                            if (inv->mNumPositionKeys == 0 && inv->mNumRotationKeys == 0 && inv->mNumScalingKeys == 0) {
                                delete inv;
                            }
                            else {
                                node_anims.push_back(inv);
                            }

                            ai_assert(TransformationComp_RotationPivotInverse > i);
                            flags |= bit << (TransformationComp_RotationPivotInverse - i);
                        }

                        break;

                    case TransformationComp_Scaling:
                    case TransformationComp_GeometricScaling:
                        na = GenerateScalingNodeAnim(chain_name,
                            target,
                            (*chain[i]).second,
                            layer_map,
                            start, stop,
                            max_time,
                            min_time);

                        break;

                    default:
                        ai_assert(false);
                    }

                    ai_assert(na);
                    if (na->mNumPositionKeys == 0 && na->mNumRotationKeys == 0 && na->mNumScalingKeys == 0) {
                        delete na;
                    }
                    else {
                        node_anims.push_back(na);
                    }
                    continue;
                }
            }

            node_anim_chain_bits[fixed_name] = flags;
        }